

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O2

uint32_t __thiscall
event_track::EventMessageInstanceBox::parse
          (EventMessageInstanceBox *this,char *ptr,uint data_size,uint64_t pres_time)

{
  uint *puVar1;
  size_type sVar2;
  uint uVar3;
  uint64_t uVar4;
  ulong uVar5;
  allocator local_49;
  string local_48 [32];
  
  uVar3 = 0;
  if (8 < data_size) {
    fmp4_stream::full_box::parse(&this->super_full_box,ptr);
    uVar4 = fmp4_stream::full_box::size(&this->super_full_box);
    puVar1 = (uint *)(ptr + uVar4);
    uVar3 = *puVar1;
    *(uint *)&(this->super_full_box).field_0x6c =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar5 = *(ulong *)(puVar1 + 1);
    this->presentation_time_delta_ =
         uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    uVar3 = puVar1[3];
    this->event_duration_ =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar3 = puVar1[4];
    this->id_ = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    std::__cxx11::string::string(local_48,(char *)(puVar1 + 5),&local_49);
    std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,local_48);
    std::__cxx11::string::~string(local_48);
    sVar2 = (this->scheme_id_uri_)._M_string_length;
    std::__cxx11::string::string(local_48,ptr + uVar4 + sVar2 + 0x15,&local_49);
    std::__cxx11::string::operator=((string *)&this->value_,local_48);
    std::__cxx11::string::~string(local_48);
    for (uVar5 = (ulong)((int)uVar4 + (int)sVar2 + (int)(this->value_)._M_string_length + 0x16);
        uVar3 = (this->super_full_box).super_box.size_, (uint)uVar5 < uVar3; uVar5 = uVar5 + 1) {
      local_48[0] = *(string *)(ptr + uVar5);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->message_data_,(uchar *)local_48);
    }
  }
  return uVar3;
}

Assistant:

uint32_t parse(const char *ptr, unsigned int data_size, uint64_t pres_time=0)
		{
			if (data_size > 8) 
			{
				fmp4_stream::full_box::parse(ptr);
				uint64_t offset = full_box::size();

				reserved_ = fmp4_read_uint32(ptr + offset);
				//cout << "timescale: " << timescale << endl;
				offset += 4;
				presentation_time_delta_ = fmp4_read_uint64(ptr + offset);
				//cout << "presentation time: " << presentation_time << endl;
				offset += 8;
				event_duration_ = fmp4_read_uint32(ptr + offset);
				//cout << "event duration: " << event_duration << endl;
				offset += 4;
				id_ = fmp4_read_uint32(ptr + offset);
				offset += 4;
				//cout << "id: " << id << endl;
				scheme_id_uri_ = std::string(ptr + offset);
				offset = offset + scheme_id_uri_.size() + 1;
				//cout << "scheme_id_uri: " << scheme_id_uri << endl;
				value_ = std::string(ptr + offset);
				//cout << "value: " << value << endl;
				offset = offset + value_.size() + 1;

				for (unsigned int i = (unsigned int)offset; i < size_; i++)
					message_data_.push_back(*(ptr + (size_t)i));

				return size_;
			}
			return 0;
		}